

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O0

int lj_cf_debug_debug(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  size_t size;
  char *local_138;
  char *s;
  char buffer [250];
  lua_State *L_local;
  
  while( true ) {
    fputs("lua_debug> ",_stderr);
    pcVar2 = fgets((char *)&s,0xfa,_stdin);
    if ((pcVar2 == (char *)0x0) || (iVar1 = strcmp((char *)&s,"cont\n"), iVar1 == 0)) break;
    size = strlen((char *)&s);
    iVar1 = luaL_loadbuffer(L,(char *)&s,size,"=(debug command)");
    if ((iVar1 != 0) || (iVar1 = lua_pcall(L,0,0,0), iVar1 != 0)) {
      local_138 = lua_tolstring(L,-1,(size_t *)0x0);
      if (local_138 == (char *)0x0) {
        local_138 = "(error object is not a string)";
      }
      fputs(local_138,_stderr);
      fputs("\n",_stderr);
    }
    lua_settop(L,0);
  }
  return 0;
}

Assistant:

LJLIB_CF(debug_debug)
{
  for (;;) {
    char buffer[250];
    fputs("lua_debug> ", stderr);
    if (fgets(buffer, sizeof(buffer), stdin) == 0 ||
	strcmp(buffer, "cont\n") == 0)
      return 0;
    if (luaL_loadbuffer(L, buffer, strlen(buffer), "=(debug command)") ||
	lua_pcall(L, 0, 0, 0)) {
      const char *s = lua_tostring(L, -1);
      fputs(s ? s : "(error object is not a string)", stderr);
      fputs("\n", stderr);
    }
    lua_settop(L, 0);  /* remove eventual returns */
  }
}